

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O2

void __thiscall CaDiCaL::Proof::begin_proof(Proof *this,uint64_t id)

{
  pointer ppTVar1;
  Tracer **tracer;
  pointer ppTVar2;
  
  ppTVar1 = (this->tracers).
            super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar2 = (this->tracers).
                 super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar2 != ppTVar1; ppTVar2 = ppTVar2 + 1) {
    (*(*ppTVar2)->_vptr_Tracer[9])(*ppTVar2,id);
  }
  return;
}

Assistant:

void Proof::begin_proof (uint64_t id) {
  LOG (clause, "PROOF begin proof");
  for (auto &tracer : tracers) {
    tracer->begin_proof (id);
  }
}